

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

int __thiscall HModel::load_fromToy(HModel *this,char *filename)

{
  int *m_p;
  int *n_p;
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  uint uVar2;
  char *pcVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  double *A;
  vector<double,_std::allocator<double>_> *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  int *intColumn;
  double *ub;
  double *lb;
  double *c;
  double *b;
  timeval local_40;
  
  clearModel(this);
  this->totalTime = 0.0;
  HTimer::reset(&this->timer);
  pcVar3 = (char *)(this->modelName)._M_string_length;
  strlen(filename);
  uVar17 = 0;
  std::__cxx11::string::_M_replace((ulong)&this->modelName,0,pcVar3,(ulong)filename);
  m_p = &this->numRow;
  n_p = &this->numCol;
  iVar9 = readToy_MIP_cpp(filename,m_p,n_p,&this->objSense,&this->objOffset,&A,&b,&c,&lb,&ub,
                          &intColumn);
  if (iVar9 == 0) {
    printf("Model has %3d rows and %3d cols\n",(ulong)(uint)*m_p,(ulong)(uint)*n_p);
    printf("Model has Objective sense is %d; Objective offset is %g\n",this->objOffset,
           (ulong)(uint)this->objSense);
    if (0 < (long)*n_p) {
      uVar2 = *m_p;
      lVar13 = 0;
      uVar17 = 0;
      pdVar10 = A;
      do {
        if (0 < (int)uVar2) {
          uVar14 = 0;
          do {
            uVar17 = uVar17 + (pdVar10[uVar14] != 0.0);
            uVar14 = uVar14 + 1;
          } while (uVar2 != uVar14);
        }
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + uVar2;
      } while (lVar13 != *n_p);
    }
    iVar11 = 0;
    printf("Model has %d nonzeros\n",(ulong)uVar17);
    std::ostream::flush();
    std::vector<int,_std::allocator<int>_>::resize(&this->Astart,(long)this->numCol + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,(long)(int)uVar17);
    std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,(long)(int)uVar17);
    piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar4 = 0;
    if (0 < this->numCol) {
      lVar13 = 0;
      do {
        iVar16 = *m_p;
        if (0 < iVar16) {
          piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar15 = 0;
          do {
            dVar1 = A[(int)lVar13 * iVar16 + lVar15];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              piVar5[iVar11] = (int)lVar15;
              pdVar6[iVar11] = dVar1;
              iVar11 = iVar11 + 1;
              iVar16 = *m_p;
            }
            lVar15 = lVar15 + 1;
          } while ((int)lVar15 < iVar16);
        }
        piVar4[lVar13 + 1] = iVar11;
        lVar13 = lVar13 + 1;
      } while (lVar13 < *n_p);
    }
    puts("Model has sparse matrix");
    std::ostream::flush();
    std::vector<double,_std::allocator<double>_>::resize(&this->colCost,(long)this->numCol);
    std::vector<double,_std::allocator<double>_>::resize(&this->colLower,(long)this->numCol);
    std::vector<double,_std::allocator<double>_>::resize(&this->colUpper,(long)this->numCol);
    this_00 = &this->integerColumn;
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->numCol);
    local_70 = &this->rowLower;
    std::vector<double,_std::allocator<double>_>::resize(local_70,(long)this->numRow);
    local_78 = &this->rowUpper;
    std::vector<double,_std::allocator<double>_>::resize(local_78,(long)this->numRow);
    if (0 < this->numCol) {
      pdVar6 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        pdVar6[lVar13] = c[lVar13];
        pdVar7[lVar13] = lb[lVar13];
        pdVar8[lVar13] = ub[lVar13];
        piVar4[lVar13] = intColumn[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 < *n_p);
    }
    puts("Model has column data");
    std::ostream::flush();
    iVar11 = *m_p;
    if (0 < (long)iVar11) {
      pdVar6 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        dVar1 = b[lVar13];
        pdVar6[lVar13] = dVar1;
        pdVar7[lVar13] = dVar1;
        lVar13 = lVar13 + 1;
      } while (iVar11 != lVar13);
    }
    iVar16 = *n_p;
    if (0 < (long)iVar16) {
      lVar13 = 0;
      iVar12 = 0;
      do {
        iVar12 = (iVar12 + 1) -
                 (uint)((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar13] == 0);
        lVar13 = lVar13 + 1;
      } while (iVar16 != lVar13);
      if (iVar12 != 0) {
        printf("MPS file has %d integer variables\n");
        iVar16 = *n_p;
        iVar11 = *m_p;
      }
    }
    this->numTot = iVar11 + iVar16;
    initScale(this);
    initWithLogicalBasis(this);
  }
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  this->totalTime =
       (((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) - (this->timer).startTime)
       + this->totalTime;
  return iVar9;
}

Assistant:

int HModel::load_fromToy(const char *filename) {
  //  int m, n, maxmin;
  //double offset;
  double *A, *b, * c, *lb, *ub;
  int *intColumn;
  // Remove any current model
  clearModel();
  
  // Initialise the total runtine for this model
  totalTime = 0;

  // Load the model, timing the process
  timer.reset();
  modelName = filename;

  int RtCd = readToy_MIP_cpp(filename, &numRow, &numCol, &objSense, &objOffset,
			     &A,
			     &b, &c, &lb, &ub,
			     &intColumn);
  if (RtCd) {
    totalTime += timer.getTime();
    return RtCd;
  }
  printf("Model has %3d rows and %3d cols\n", numRow, numCol);
  printf("Model has Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
  int numNz = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) numNz++;
    }
  }
  printf("Model has %d nonzeros\n", numNz);cout<<flush;
  Astart.resize(numCol+1);
  Aindex.resize(numNz);
  Avalue.resize(numNz);
  Astart[0] = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    int el_n = Astart[c_n];
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) {
  	Aindex[el_n] = r_n;
  	Avalue[el_n] = r_v;
  	el_n++;
      }
    }
    Astart[c_n+1] = el_n;
  }
  printf("Model has sparse matrix\n");cout<<flush;
  colCost.resize(numCol);
  colLower.resize(numCol);
  colUpper.resize(numCol);
  integerColumn.resize(numCol);
  rowLower.resize(numRow);
  rowUpper.resize(numRow);

  for (int c_n = 0; c_n<numCol; c_n++) {
    colCost[c_n] = c[c_n];
    colLower[c_n] = lb[c_n];
    colUpper[c_n] = ub[c_n];
    integerColumn[c_n] = intColumn[c_n];
  }
  printf("Model has column data\n");cout<<flush;
  for (int r_n = 0; r_n<numRow; r_n++) {
    rowLower[r_n] = b[r_n];
    rowUpper[r_n] = b[r_n];
  }  
#ifdef JAJH_dev
  int numIntegerColumn = 0;
  for (int c_n=0; c_n<numCol; c_n++) {
    if (integerColumn[c_n]) numIntegerColumn++;
  }
  if (numIntegerColumn) printf("MPS file has %d integer variables\n", numIntegerColumn);
#endif
 
  numTot = numCol + numRow;

#ifdef JAJH_dev
  //Use this next line to check the loading of a model from arrays
  //check_load_fromArrays(); return;
#endif

  // Assign and initialise the scaling factors
  initScale();
  
  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
  return RtCd;
}